

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::CharSet<char16_t>::Get_helper(CharSet<char16_t> *this,uint k)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte bVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  uint uVar8;
  bool bVar9;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x511,"(!IsCompact())","!IsCompact()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar7 = (undefined8 *)(this->rep).compact.countPlusOne;
  bVar3 = puVar7 == &CharSetFull::Instance;
  if (bVar3) {
    bVar9 = false;
    puVar6 = &CharSetFull::Instance;
  }
  else {
    bVar5 = 0xc;
    uVar8 = 3;
    bVar9 = false;
    do {
      puVar1 = (undefined8 *)puVar7[(ulong)(k >> (bVar5 & 0x1f) & 0xf) + 1];
      puVar6 = puVar7;
      if (puVar1 == (undefined8 *)0x0) break;
      uVar8 = uVar8 - 1;
      bVar9 = uVar8 < 2;
      puVar6 = puVar1;
      if (bVar9) break;
      bVar5 = bVar5 - 4;
      bVar3 = puVar1 == &CharSetFull::Instance;
      puVar6 = &CharSetFull::Instance;
      puVar7 = puVar1;
    } while (!bVar3);
  }
  if (bVar9) {
    if (puVar6 == &CharSetFull::Instance) {
      bVar3 = true;
    }
    else {
      bVar3 = (*(uint *)((long)puVar6 + (ulong)(k >> 3 & 0x1c) + 8) >> (k & 0x1f) & 1) != 0;
    }
  }
  return bVar3;
}

Assistant:

bool CharSet<char16>::Get_helper(uint k) const
    {
        Assert(!IsCompact());
        CharSetNode* curr = rep.full.root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }